

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void r_code::Utils::SetTimestamp(Code *object,uint16_t index,uint64_t t)

{
  Atom *pAVar1;
  undefined6 in_register_00000032;
  int iVar2;
  Atom local_24;
  Atom local_20;
  Atom local_1c;
  
  Atom::Timestamp();
  iVar2 = (int)CONCAT62(in_register_00000032,index);
  pAVar1 = (Atom *)(**(code **)(*(long *)object + 0x20))
                             (object,CONCAT62(in_register_00000032,index) & 0xffffffff);
  Atom::operator=(pAVar1,&local_1c);
  Atom::~Atom(&local_1c);
  Atom::Atom(&local_20,(uint32_t)(t >> 0x20));
  pAVar1 = (Atom *)(**(code **)(*(long *)object + 0x20))(object,iVar2 + 1U & 0xffff);
  Atom::operator=(pAVar1,&local_20);
  Atom::~Atom(&local_20);
  Atom::Atom(&local_24,(uint32_t)t);
  pAVar1 = (Atom *)(**(code **)(*(long *)object + 0x20))(object,iVar2 + 2U & 0xffff);
  Atom::operator=(pAVar1,&local_24);
  Atom::~Atom(&local_24);
  return;
}

Assistant:

void Utils::SetTimestamp(Code *object, uint16_t index, uint64_t t)
{
    object->code(index) = Atom::Timestamp();
    object->code(++index) = Atom(t >> 32);
    object->code(++index) = Atom(t & UINT32_MAX);
}